

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O3

int Lodtalk::IdentityDictionary::stPutAssociation(InterpreterProxy *interpreter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Oop keyValue;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_01;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    keyValue.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    keyValue.field_0.uintValue._4_4_ = extraout_var_01;
    iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
    HashedCollection::
    internalPutKeyValue<Lodtalk::Oop(Lodtalk::Oop),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
              ((HashedCollection *)CONCAT44(extraout_var_00,iVar1),
               (VMContext *)CONCAT44(extraout_var_02,iVar2),keyValue,getLookupKeyKey,identityHashOf,
               identityOopEquals);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])
                      (interpreter,CONCAT44(extraout_var_03,iVar1));
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int IdentityDictionary::stPutAssociation(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop selfOop = interpreter->getReceiver();
    Oop association = interpreter->getTemporary(0);
    auto self = reinterpret_cast<IdentityDictionary*> (selfOop.pointer);
    self->putAssociation(interpreter->getContext(), association);
    return interpreter->returnOop(interpreter->getTemporary(0));
}